

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O3

lzma_ret lzma_block_decoder_init
                   (lzma_next_coder_conflict10 *next,lzma_allocator *allocator,lzma_block *block)

{
  uint uVar1;
  uint32_t uVar2;
  lzma_ret lVar3;
  lzma_vli lVar4;
  lzma_coder_conflict11 *plVar5;
  lzma_check type;
  
  if ((code *)next->init != lzma_block_decoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_block_decoder_init;
  lVar4 = lzma_block_unpadded_size(block);
  if ((lVar4 != 0) && (-2 < (long)block->uncompressed_size)) {
    plVar5 = next->coder;
    if (plVar5 == (lzma_coder_conflict11 *)0x0) {
      plVar5 = (lzma_coder_conflict11 *)lzma_alloc(0xd8,allocator);
      next->coder = plVar5;
      if (plVar5 == (lzma_coder_conflict11 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->code = block_decode;
      next->end = block_decoder_end;
      (plVar5->next).memconfig =
           (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict10 *)0x0;
      (plVar5->next).update =
           (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict10
            *)0x0;
      (plVar5->next).end = (lzma_end_function_conflict9)0x0;
      (plVar5->next).get_check = (_func_lzma_check_lzma_coder_ptr_conflict10 *)0x0;
      (plVar5->next).init = 0;
      (plVar5->next).code = (lzma_code_function_conflict9)0x0;
      (plVar5->next).coder = (lzma_coder_conflict11 *)0x0;
      (plVar5->next).id = 0xffffffffffffffff;
    }
    plVar5->sequence = SEQ_CODE;
    plVar5->block = block;
    plVar5->compressed_size = 0;
    plVar5->uncompressed_size = 0;
    lVar4 = block->compressed_size;
    if (lVar4 == 0xffffffffffffffff) {
      uVar1 = block->header_size;
      type = block->check;
      uVar2 = lzma_check_size(type);
      lVar4 = 0x7ffffffffffffffc - ((ulong)uVar2 + (ulong)uVar1);
    }
    else {
      type = block->check;
    }
    plVar5->compressed_limit = lVar4;
    plVar5->check_pos = 0;
    lzma_check_init(&plVar5->check,type);
    lVar3 = lzma_raw_decoder_init((lzma_next_coder *)&next->coder->next,allocator,block->filters);
    return lVar3;
  }
  return LZMA_PROG_ERROR;
}

Assistant:

extern lzma_ret
lzma_block_decoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		lzma_block *block)
{
	lzma_next_coder_init(&lzma_block_decoder_init, next, allocator);

	// Validate the options. lzma_block_unpadded_size() does that for us
	// except for Uncompressed Size and filters. Filters are validated
	// by the raw decoder.
	if (lzma_block_unpadded_size(block) == 0
			|| !lzma_vli_is_valid(block->uncompressed_size))
		return LZMA_PROG_ERROR;

	// Allocate and initialize *next->coder if needed.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &block_decode;
		next->end = &block_decoder_end;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	next->coder->sequence = SEQ_CODE;
	next->coder->block = block;
	next->coder->compressed_size = 0;
	next->coder->uncompressed_size = 0;

	// If Compressed Size is not known, we calculate the maximum allowed
	// value so that encoded size of the Block (including Block Padding)
	// is still a valid VLI and a multiple of four.
	next->coder->compressed_limit
			= block->compressed_size == LZMA_VLI_UNKNOWN
				? (LZMA_VLI_MAX & ~LZMA_VLI_C(3))
					- block->header_size
					- lzma_check_size(block->check)
				: block->compressed_size;

	// Initialize the check. It's caller's problem if the Check ID is not
	// supported, and the Block decoder cannot verify the Check field.
	// Caller can test lzma_check_is_supported(block->check).
	next->coder->check_pos = 0;
	lzma_check_init(&next->coder->check, block->check);

	// Initialize the filter chain.
	return lzma_raw_decoder_init(&next->coder->next, allocator,
			block->filters);
}